

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Matchers::StartsWithMatcher::match(StartsWithMatcher *this,string *source)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  
  CasedString::adjustString((CasedString *)&stack0xffffffffffffffd0,in_RDI);
  bVar1 = startsWith(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool StartsWithMatcher::match( std::string const& source ) const {
        return startsWith( m_comparator.adjustString( source ), m_comparator.m_str );
    }